

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceBitfieldInsert_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,DataType baseDataType,DataType insertDataType,
          DataType offsetDataType,DataType bitsDataType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  ostream *poVar3;
  ShaderType shaderType_00;
  allocator<char> local_2d4;
  allocator<char> local_2d3;
  allocator<char> local_2d2;
  allocator<char> local_2d1;
  string *local_2d0;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream source;
  
  shaderType_00 = shaderType;
  local_2d0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar3 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  getShaderInitialization_abi_cxx11_
            (&local_1c8,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"base",&local_2d1);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_1e8,shaderType,&local_208);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"insert",&local_2d2);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_228,baseDataType,&local_248);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"offset",&local_2d3);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_268,insertDataType,&local_288);
  poVar3 = std::operator<<(poVar3,(string *)&local_268);
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"bits",&local_2d4);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_2a8,offsetDataType,&local_2c8);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
  poVar3 = std::operator<<(poVar3,"    bitfieldInsert(base, insert, offset, bits);\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  return local_2d0;
}

Assistant:

std::string genShaderSourceBitfieldInsert (NegativeTestContext& ctx, glu::ShaderType shaderType, glu::DataType baseDataType, glu::DataType insertDataType, glu::DataType offsetDataType, glu::DataType bitsDataType)
{
	std::ostringstream source;
	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< "void main(void)\n"
			<< "{\n"
			<< "    " << declareAndInitializeShaderVariable(baseDataType, "base")
			<< "    " << declareAndInitializeShaderVariable(insertDataType, "insert")
			<< "    " << declareAndInitializeShaderVariable(offsetDataType, "offset")
			<< "    " << declareAndInitializeShaderVariable(bitsDataType, "bits")
			<< "    bitfieldInsert(base, insert, offset, bits);\n"
			<< "}\n";

	return source.str();
}